

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testReader.c
# Opt level: O0

void usage(char *progname)

{
  char *progname_local;
  
  printf("Usage : %s [options] XMLfiles ...\n",progname);
  printf("\tParse the XML files using the xmlTextReader API\n");
  printf("\t --count: count the number of attribute and elements\n");
  printf("\t --valid: validate the document\n");
  printf("\t --consumed: count the number of bytes consumed\n");
  exit(1);
}

Assistant:

static void usage(const char *progname) {
    printf("Usage : %s [options] XMLfiles ...\n", progname);
    printf("\tParse the XML files using the xmlTextReader API\n");
    printf("\t --count: count the number of attribute and elements\n");
    printf("\t --valid: validate the document\n");
    printf("\t --consumed: count the number of bytes consumed\n");
    exit(1);
}